

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::TeamCityReporter::testCaseStarting(TeamCityReporter *this,TestCaseInfo *testInfo)

{
  uint64_t uVar1;
  ostream *poVar2;
  size_type in_RCX;
  StringRef str;
  string local_38;
  
  uVar1 = std::chrono::_V2::system_clock::now();
  (this->m_testTimer).m_nanoseconds = uVar1;
  (this->super_StreamingReporterBase).currentTestCaseInfo = testInfo;
  poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"##teamcity[testStarted name=\'",0x1d);
  str.m_size = in_RCX;
  str.m_start = (char *)(testInfo->name)._M_string_length;
  (anonymous_namespace)::escape_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)(testInfo->name)._M_dataplus._M_p,str);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\']\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  std::ostream::flush();
  return;
}

Assistant:

void TeamCityReporter::testCaseStarting(TestCaseInfo const& testInfo) {
        m_testTimer.start();
        StreamingReporterBase::testCaseStarting(testInfo);
        m_stream << "##teamcity[testStarted name='"
            << escape(testInfo.name) << "']\n";
        m_stream.flush();
    }